

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void Json::StreamWriterBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  Value local_110;
  Value local_e8;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_38;
  Value *local_10;
  Value *settings_local;
  
  local_10 = settings;
  Value::Value(&local_38,"All");
  pVVar1 = Value::operator[](local_10,"commentStyle");
  Value::operator=(pVVar1,&local_38);
  Value::~Value(&local_38);
  Value::Value(&local_70,"\t");
  pVVar1 = Value::operator[](local_10,"indentation");
  Value::operator=(pVVar1,&local_70);
  Value::~Value(&local_70);
  Value::Value(&local_98,false);
  pVVar1 = Value::operator[](local_10,"enableYAMLCompatibility");
  Value::operator=(pVVar1,&local_98);
  Value::~Value(&local_98);
  Value::Value(&local_c0,false);
  pVVar1 = Value::operator[](local_10,"dropNullPlaceholders");
  Value::operator=(pVVar1,&local_c0);
  Value::~Value(&local_c0);
  Value::Value(&local_e8,false);
  pVVar1 = Value::operator[](local_10,"useSpecialFloats");
  Value::operator=(pVVar1,&local_e8);
  Value::~Value(&local_e8);
  Value::Value(&local_110,0x11);
  pVVar1 = Value::operator[](local_10,"precision");
  Value::operator=(pVVar1,&local_110);
  Value::~Value(&local_110);
  return;
}

Assistant:

void StreamWriterBuilder::setDefaults(Json::Value* settings)
{
  //! [StreamWriterBuilderDefaults]
  (*settings)["commentStyle"] = "All";
  (*settings)["indentation"] = "\t";
  (*settings)["enableYAMLCompatibility"] = false;
  (*settings)["dropNullPlaceholders"] = false;
  (*settings)["useSpecialFloats"] = false;
  (*settings)["precision"] = 17;
  //! [StreamWriterBuilderDefaults]
}